

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool __thiscall slang::CommandLine::parse(CommandLine *this,int argc,char **argv)

{
  byte bVar1;
  int in_ESI;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> *in_RDI;
  int i;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> args;
  CommandLine *in_stack_00000300;
  ParseOptions in_stack_0000030c;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
  in_stack_00000310;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff10;
  undefined1 local_c8 [188];
  int local_c;
  
  local_c = in_ESI;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL>::SmallVector
            ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> *)
             (local_c8 + 0x18),(long)in_ESI);
  for (local_c8._16_4_ = 0; (int)local_c8._16_4_ < local_c; local_c8._16_4_ = local_c8._16_4_ + 1) {
    this_00 = (SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_c8;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff10,(char *)in_RDI);
    SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::push_back
              (this_00,(basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  }
  std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
  span<slang::SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL>_&>
            ((span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
              *)in_stack_ffffffffffffff10,in_RDI);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xffffffffffffff14);
  bVar1 = parse(in_stack_00000300,in_stack_00000310,in_stack_0000030c);
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL>::~SmallVector
            ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> *)0x2a944f);
  return (bool)(bVar1 & 1);
}

Assistant:

bool CommandLine::parse(int argc, const char* const argv[]) {
    SmallVector<std::string_view, 8> args{size_t(argc), UninitializedTag()};
    for (int i = 0; i < argc; i++)
        args.push_back(argv[i]);

    return parse(args);
}